

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O0

Elf_Half __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::add_section_index
          (segment_impl<ELFIO::Elf32_Phdr> *this,Elf_Half sec_index,Elf_Xword addr_align)

{
  value_type_conflict *pvVar1;
  size_type sVar2;
  value_type_conflict *in_RDX;
  undefined2 in_SI;
  long *in_RDI;
  value_type_conflict *pvVar3;
  undefined6 in_stack_fffffffffffffff0;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             CONCAT26(in_SI,in_stack_fffffffffffffff0),in_RDX);
  pvVar3 = in_RDX;
  pvVar1 = (value_type_conflict *)(**(code **)(*in_RDI + 0x38))();
  if (pvVar1 < in_RDX) {
    (**(code **)(*in_RDI + 0x40))(in_RDI,pvVar3);
  }
  sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 8));
  return (Elf_Half)sVar2;
}

Assistant:

Elf_Half
    add_section_index( Elf_Half sec_index, Elf_Xword addr_align )
    {
        sections.push_back( sec_index );
        if ( addr_align > get_align() ) {
            set_align( addr_align );
        }

        return (Elf_Half)sections.size();
    }